

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O3

void QtMWidgets::drawArrow(QPainter *p,QRect *r,QColor *color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QPainterPath path;
  undefined1 local_60 [8];
  undefined1 local_58 [24];
  double local_40;
  double local_38;
  
  iVar5 = r->x2;
  iVar6 = r->x1;
  iVar7 = r->y2 - r->y1;
  QPainterPath::QPainterPath((QPainterPath *)local_60);
  uVar1 = r->x1;
  uVar3 = r->y1;
  local_58._8_4_ = SUB84((double)(int)uVar3,0);
  local_58._0_8_ = (double)(int)uVar1;
  local_58._12_4_ = (int)((ulong)(double)(int)uVar3 >> 0x20);
  QPainterPath::moveTo((QPointF *)local_60);
  local_40 = (double)(((iVar5 - iVar6) + 1) / 3);
  local_58._8_8_ = (undefined8)r->y1;
  local_58._0_8_ = (double)r->x1 + local_40;
  QPainterPath::lineTo((QPointF *)local_60);
  local_38 = (double)((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1);
  local_58._0_8_ = (undefined8)(r->x2 + 1);
  local_58._8_8_ = (double)r->y1 + local_38;
  QPainterPath::lineTo((QPointF *)local_60);
  local_58._8_8_ = (undefined8)(r->y2 + 1);
  local_58._0_8_ = (double)r->x1 + local_40;
  QPainterPath::lineTo((QPointF *)local_60);
  local_58._0_8_ = (undefined8)r->x1;
  local_58._8_8_ = (undefined8)(r->y2 + 1);
  QPainterPath::lineTo((QPointF *)local_60);
  local_58._8_8_ = local_38 + (double)r->y1;
  local_58._0_8_ = (double)(r->x2 + 1) - local_40;
  QPainterPath::lineTo((QPointF *)local_60);
  uVar2 = r->x1;
  uVar4 = r->y1;
  local_58._8_4_ = SUB84((double)(int)uVar4,0);
  local_58._0_8_ = (double)(int)uVar2;
  local_58._12_4_ = (int)((ulong)(double)(int)uVar4 >> 0x20);
  QPainterPath::lineTo((QPointF *)local_60);
  QPainter::setPen((QColor *)p);
  QBrush::QBrush((QBrush *)local_58,color,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)local_58);
  QPainter::drawPath((QPainterPath *)p);
  QPainterPath::~QPainterPath((QPainterPath *)local_60);
  return;
}

Assistant:

void drawArrow( QPainter * p, const QRect & r,
	const QColor & color )
{
	const qreal width = r.width() / 3;
	const qreal middle = r.height() / 2;

	QPainterPath path;
	path.moveTo( r.x(), r.y() );
	path.lineTo( r.x() + width, r.y() );
	path.lineTo( r.x() + r.width(), r.y() + middle );
	path.lineTo( r.x() + width, r.y() + r.height() );
	path.lineTo( r.x(), r.y() + r.height() );
	path.lineTo( r.x() + r.width() - width, r.y() + middle );
	path.lineTo( r.x(), r.y() );

	p->setPen( color );
	p->setBrush( color );
	p->drawPath( path );
}